

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O0

int Nova::Parse_Args::Find_And_Remove_Integer(char *str,int *argc,char **argv)

{
  int iVar1;
  int local_30;
  int i;
  int value;
  char **argv_local;
  int *argc_local;
  char *str_local;
  
  local_30 = 0;
  while ((local_30 < *argc && (iVar1 = strcmp(str,argv[local_30]), iVar1 != 0))) {
    local_30 = local_30 + 1;
  }
  if (local_30 + 1 < *argc) {
    str_local._4_4_ = atoi(argv[local_30 + 1]);
    for (; local_30 < *argc + -2; local_30 = local_30 + 1) {
      argv[local_30] = argv[local_30 + 2];
    }
    *argc = *argc + -1;
    argv[*argc] = (char *)0x0;
    *argc = *argc + -1;
    argv[*argc] = (char *)0x0;
  }
  else {
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int Parse_Args::
Find_And_Remove_Integer(const char *str,int& argc,char** argv)
{
    int value,i;
    for(i=0;i<argc;i++) if(!strcmp(str,argv[i])) break;
    if(i+1<argc)
    {
        value=atoi(argv[i+1]);
        for(;i<argc-2;i++) argv[i]=argv[i+2];
        argc--;
        argv[argc]=0;
        argc--;
        argv[argc]=0;
        return value;
    }
    return 0;
}